

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# php_generator.cc
# Opt level: O2

void google::protobuf::compiler::php::GenerateHead(FileDescriptor *file,Printer *printer)

{
  io::Printer::Print<char[9],std::__cxx11::string>
            (printer,
             "<?php\n# Generated by the protocol buffer compiler.  DO NOT EDIT!\n# source: ^filename^\n\n"
             ,(char (*) [9])"filename",
             *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)file);
  return;
}

Assistant:

void GenerateHead(const FileDescriptor* file, io::Printer* printer) {
  printer->Print(
    "<?php\n"
    "# Generated by the protocol buffer compiler.  DO NOT EDIT!\n"
    "# source: ^filename^\n"
    "\n",
    "filename", file->name());
}